

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Client_deleteNode(UA_Client *client,UA_NodeId nodeId,UA_Boolean deleteTargetReferences)

{
  UA_DeleteNodesRequest request_00;
  undefined1 local_168 [4];
  UA_StatusCode retval;
  UA_DeleteNodesResponse response;
  UA_DeleteNodesRequest request;
  UA_DeleteNodesItem item;
  UA_Boolean deleteTargetReferences_local;
  UA_Client *client_local;
  
  UA_DeleteNodesItem_init((UA_DeleteNodesItem *)&request.nodesToDelete);
  request.nodesToDelete = (UA_DeleteNodesItem *)nodeId._0_8_;
  UA_DeleteNodesRequest_init((UA_DeleteNodesRequest *)&response.diagnosticInfos);
  request.nodesToDeleteSize = (size_t)&request.nodesToDelete;
  request.requestHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0x1;
  request_00.requestHeader.authenticationToken.identifier._0_2_ =
       request.requestHeader.authenticationToken.namespaceIndex;
  request_00.requestHeader.authenticationToken.identifier._2_2_ =
       request.requestHeader.authenticationToken._2_2_;
  request_00.requestHeader.authenticationToken.identifier._4_4_ =
       request.requestHeader.authenticationToken.identifierType;
  request_00.requestHeader.authenticationToken._0_8_ = response.diagnosticInfos;
  request_00.requestHeader.authenticationToken.identifier.string.data =
       (UA_Byte *)request.requestHeader.authenticationToken.identifier.string.length;
  request_00.requestHeader.timestamp =
       (UA_DateTime)request.requestHeader.authenticationToken.identifier.string.data;
  request_00.requestHeader.requestHandle = (undefined4)request.requestHeader.timestamp;
  request_00.requestHeader.returnDiagnostics = request.requestHeader.timestamp._4_4_;
  request_00.requestHeader.auditEntryId.length._0_4_ = request.requestHeader.requestHandle;
  request_00.requestHeader.auditEntryId.length._4_4_ = request.requestHeader.returnDiagnostics;
  request_00.requestHeader.auditEntryId.data = (UA_Byte *)request.requestHeader.auditEntryId.length;
  request_00.requestHeader._56_8_ = request.requestHeader.auditEntryId.data;
  request_00.requestHeader.additionalHeader.encoding = request.requestHeader.timeoutHint;
  request_00.requestHeader.additionalHeader._4_4_ = request.requestHeader._60_4_;
  request_00.requestHeader.additionalHeader.content.decoded.type =
       (UA_DataType *)request.requestHeader.additionalHeader._0_8_;
  request_00.requestHeader.additionalHeader.content.decoded.data =
       request.requestHeader.additionalHeader.content.decoded.type;
  request_00.requestHeader.additionalHeader.content._16_8_ =
       request.requestHeader.additionalHeader.content.decoded.data;
  request_00.requestHeader.additionalHeader.content.encoded.body.length =
       request.requestHeader.additionalHeader.content._16_8_;
  request_00.requestHeader.additionalHeader.content.encoded.body.data =
       (UA_Byte *)request.requestHeader.additionalHeader.content.encoded.body.length;
  request_00.nodesToDeleteSize = 1;
  request_00.nodesToDelete = (UA_DeleteNodesItem *)request.nodesToDeleteSize;
  UA_Client_Service_deleteNodes((UA_DeleteNodesResponse *)local_168,client,request_00);
  if (response.responseHeader.timestamp._4_4_ == 0) {
    if (response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1) {
      client_local._4_4_ = *(UA_StatusCode *)response.resultsSize;
      UA_DeleteNodesResponse_deleteMembers((UA_DeleteNodesResponse *)local_168);
    }
    else {
      UA_DeleteNodesResponse_deleteMembers((UA_DeleteNodesResponse *)local_168);
      client_local._4_4_ = 0x80010000;
    }
  }
  else {
    UA_DeleteNodesResponse_deleteMembers((UA_DeleteNodesResponse *)local_168);
    client_local._4_4_ = response.responseHeader.timestamp._4_4_;
  }
  return client_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_deleteNode(UA_Client *client, const UA_NodeId nodeId,
                     UA_Boolean deleteTargetReferences) {
    UA_DeleteNodesItem item;
    UA_DeleteNodesItem_init(&item);
    item.nodeId = nodeId;
    item.deleteTargetReferences = deleteTargetReferences;
    UA_DeleteNodesRequest request;
    UA_DeleteNodesRequest_init(&request);
    request.nodesToDelete = &item;
    request.nodesToDeleteSize = 1;
    UA_DeleteNodesResponse response = UA_Client_Service_deleteNodes(client, request);
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval != UA_STATUSCODE_GOOD) {
        UA_DeleteNodesResponse_deleteMembers(&response);
        return retval;
    }
    if(response.resultsSize != 1) {
        UA_DeleteNodesResponse_deleteMembers(&response);
        return UA_STATUSCODE_BADUNEXPECTEDERROR;
    }
    retval = response.results[0];
    UA_DeleteNodesResponse_deleteMembers(&response);
    return retval;
}